

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parquet_types.cpp
# Opt level: O3

void __thiscall duckdb_parquet::FileMetaData::FileMetaData(FileMetaData *this)

{
  *(undefined ***)this = &PTR__FileMetaData_024772a8;
  this->version = 0;
  (this->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->schema).
  super_vector<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  super__Vector_base<duckdb_parquet::SchemaElement,_std::allocator<duckdb_parquet::SchemaElement>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->num_rows = 0;
  (this->row_groups).
  super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->row_groups).
  super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->row_groups).
  super_vector<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>.
  super__Vector_base<duckdb_parquet::RowGroup,_std::allocator<duckdb_parquet::RowGroup>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->key_value_metadata).
  super_vector<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>.
  super__Vector_base<duckdb_parquet::KeyValue,_std::allocator<duckdb_parquet::KeyValue>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->created_by)._M_dataplus._M_p = (pointer)&(this->created_by).field_2;
  (this->created_by)._M_string_length = 0;
  (this->created_by).field_2._M_local_buf[0] = '\0';
  (this->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->column_orders).
  super_vector<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  super__Vector_base<duckdb_parquet::ColumnOrder,_std::allocator<duckdb_parquet::ColumnOrder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  EncryptionAlgorithm::EncryptionAlgorithm(&this->encryption_algorithm);
  (this->footer_signing_key_metadata)._M_dataplus._M_p =
       (pointer)&(this->footer_signing_key_metadata).field_2;
  (this->footer_signing_key_metadata)._M_string_length = 0;
  (this->footer_signing_key_metadata).field_2._M_local_buf[0] = '\0';
  this->__isset = (_FileMetaData__isset)((byte)this->__isset & 0xe0);
  return;
}

Assistant:

FileMetaData::FileMetaData() noexcept
   : version(0),
     num_rows(0),
     created_by(),
     footer_signing_key_metadata() {
}